

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROCmActivityProfileController.cpp
# Opt level: O2

ChannelController *
anon_unknown.dwarf_4b4e57::make_controller(char *name,config_map_t *initial_cfg,Options *opts)

{
  ChannelController *this;
  bool bVar1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var2;
  ostream *poVar3;
  config_map_t *pcVar4;
  string *psVar5;
  mapped_type *pmVar6;
  info_map_t *metadata;
  bool bVar7;
  allocator<char> local_321;
  key_type local_320;
  key_type local_300;
  ChannelController *local_2e0;
  string local_query;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  services;
  string cross_select;
  string cross_query;
  string format;
  string local_select;
  
  local_2e0 = (ChannelController *)operator_new(0x18);
  cali::services::get_available_services_abi_cxx11_();
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[10]>>
                    (services.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     services.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,"mpireport");
  bVar7 = _Var2._M_current !=
          services.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  bVar1 = cali::ConfigManager::Options::is_set(opts,"aggregate_across_ranks");
  if (bVar1) {
    cali::ConfigManager::Options::get_abi_cxx11_(&cross_select,opts,"aggregate_across_ranks","");
    std::__cxx11::string::string((string *)&local_select,(string *)&cross_select);
    bVar7 = cali::StringConverter::to_bool((StringConverter *)&local_select,(bool *)0x0);
    std::__cxx11::string::~string((string *)&local_select);
    std::__cxx11::string::~string((string *)&cross_select);
  }
  this = local_2e0;
  if (bVar7 == true &&
      _Var2._M_current ==
      services.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::ofstream::ofstream(&local_select);
    poVar3 = cali::Log::stream((Log *)&local_select);
    poVar3 = std::operator<<(poVar3,
                             "rocm-activity: cannot enable mpi support: mpireport service is not available."
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    std::ofstream::~ofstream(&local_select);
    bVar7 = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&services);
  cali::ChannelController::ChannelController(this,name,0,initial_cfg);
  this->_vptr_ChannelController = (_func_int **)&PTR_on_create_002911c0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_select,
             " inclusive_scale(sum#time.duration.ns,1e-9) as \"Host Time\",inclusive_scale(sum#rocm.activity.duration,1e-9) as \"GPU Time\",inclusive_ratio(sum#rocm.activity.duration,sum#time.duration.ns,100.0) as \"GPU %\""
             ,(allocator<char> *)&cross_select);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cross_select,
             " avg(iscale#sum#time.duration.ns) as \"Avg Host Time\",max(iscale#sum#time.duration.ns) as \"Max Host Time\",avg(iscale#sum#rocm.activity.duration) as \"Avg GPU Time\",max(iscale#sum#rocm.activity.duration) as \"Max GPU Time\",ratio(iscale#sum#rocm.activity.duration,iscale#sum#time.duration.ns,100.0) as \"GPU %\""
             ,(allocator<char> *)&services);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&services,"path",(allocator<char> *)&format);
  bVar1 = cali::ConfigManager::Options::is_enabled(opts,"show_kernels");
  if (bVar1) {
    std::__cxx11::string::append((char *)&services);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_query,"rocm.kernel.name as Kernel,",(allocator<char> *)&cross_query)
    ;
    std::operator+(&format,&local_query,&local_select);
    std::__cxx11::string::operator=((string *)&local_select,(string *)&format);
    std::__cxx11::string::~string((string *)&format);
    std::__cxx11::string::~string((string *)&local_query);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_query,"rocm.kernel.name as Kernel,",(allocator<char> *)&cross_query)
    ;
    std::operator+(&format,&local_query,&cross_select);
    std::__cxx11::string::operator=((string *)&cross_select,(string *)&format);
    std::__cxx11::string::~string((string *)&format);
    std::__cxx11::string::~string((string *)&local_query);
  }
  pcVar4 = cali::ChannelController::config_abi_cxx11_(this);
  cali::util::build_tree_format_spec(&format,pcVar4,opts,"");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_query,"select ",(allocator<char> *)&cross_query);
  std::__cxx11::string::append((string *)&local_query);
  psVar5 = (string *)std::__cxx11::string::append((char *)&local_query);
  std::__cxx11::string::append(psVar5);
  psVar5 = (string *)std::__cxx11::string::append((char *)&local_query);
  std::__cxx11::string::append(psVar5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cross_query,"select ",(allocator<char> *)&local_320);
  std::__cxx11::string::append((string *)&cross_query);
  psVar5 = (string *)std::__cxx11::string::append((char *)&cross_query);
  std::__cxx11::string::append(psVar5);
  psVar5 = (string *)std::__cxx11::string::append((char *)&cross_query);
  std::__cxx11::string::append(psVar5);
  if (bVar7 == false) {
    pcVar4 = cali::ChannelController::config_abi_cxx11_(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"CALI_SERVICES_ENABLE",(allocator<char> *)&local_300);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pcVar4,&local_320);
    std::__cxx11::string::append((char *)pmVar6);
    std::__cxx11::string::~string((string *)&local_320);
    cali::ConfigManager::Options::get_abi_cxx11_(&local_320,opts,"output","stderr");
    pcVar4 = cali::ChannelController::config_abi_cxx11_(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"CALI_REPORT_FILENAME",&local_321);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pcVar4,&local_300);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_320);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_320);
    cali::ConfigManager::Options::get_abi_cxx11_(&local_320,opts,"output.append","");
    pcVar4 = cali::ChannelController::config_abi_cxx11_(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"CALI_REPORT_APPEND",&local_321);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pcVar4,&local_300);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_320);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_320);
    cali::ConfigManager::Options::build_query(&local_320,opts,"local",&local_query);
    pcVar4 = cali::ChannelController::config_abi_cxx11_(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"CALI_REPORT_CONFIG",&local_321);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pcVar4,&local_300);
  }
  else {
    pcVar4 = cali::ChannelController::config_abi_cxx11_(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"CALI_SERVICES_ENABLE",(allocator<char> *)&local_300);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pcVar4,&local_320);
    std::__cxx11::string::append((char *)pmVar6);
    std::__cxx11::string::~string((string *)&local_320);
    cali::ConfigManager::Options::get_abi_cxx11_(&local_320,opts,"output","stderr");
    pcVar4 = cali::ChannelController::config_abi_cxx11_(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"CALI_MPIREPORT_FILENAME",&local_321);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pcVar4,&local_300);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_320);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_320);
    cali::ConfigManager::Options::get_abi_cxx11_(&local_320,opts,"output.append","");
    pcVar4 = cali::ChannelController::config_abi_cxx11_(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"CALI_MPIREPORT_APPEND",&local_321);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pcVar4,&local_300);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_320);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_320);
    pcVar4 = cali::ChannelController::config_abi_cxx11_(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"CALI_MPIREPORT_WRITE_ON_FINALIZE",(allocator<char> *)&local_300
              );
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pcVar4,&local_320);
    std::__cxx11::string::assign((char *)pmVar6);
    std::__cxx11::string::~string((string *)&local_320);
    cali::ConfigManager::Options::build_query(&local_320,opts,"local",&local_query);
    pcVar4 = cali::ChannelController::config_abi_cxx11_(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"CALI_MPIREPORT_LOCAL_CONFIG",&local_321);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pcVar4,&local_300);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_320);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_320);
    cali::ConfigManager::Options::build_query(&local_320,opts,"cross",&cross_query);
    pcVar4 = cali::ChannelController::config_abi_cxx11_(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"CALI_MPIREPORT_CONFIG",&local_321);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pcVar4,&local_300);
  }
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_320);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)&local_320);
  pcVar4 = cali::ChannelController::config_abi_cxx11_(this);
  cali::ConfigManager::Options::update_channel_config(opts,pcVar4);
  metadata = cali::ChannelController::metadata_abi_cxx11_(this);
  cali::ConfigManager::Options::update_channel_metadata(opts,metadata);
  std::__cxx11::string::~string((string *)&cross_query);
  std::__cxx11::string::~string((string *)&local_query);
  std::__cxx11::string::~string((string *)&format);
  std::__cxx11::string::~string((string *)&services);
  std::__cxx11::string::~string((string *)&cross_select);
  std::__cxx11::string::~string((string *)&local_select);
  return this;
}

Assistant:

cali::ChannelController* make_controller(
    const char*                         name,
    const config_map_t&                 initial_cfg,
    const cali::ConfigManager::Options& opts
)
{
    std::string format = opts.get("output.format", "cali");

    if (format == "hatchet")
        format = "json-split";

    if (!(format == "json-split" || format == "json" || format == "cali")) {
        format = "cali";
        Log(0).stream() << "hatchet-region-profile: Unknown output format \"" << format << "\". Using json-split."
                        << std::endl;
    }

    return new RocmActivityProfileController(name, initial_cfg, opts, format);
}